

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::GetListValues
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx,TYPE *start_value,
          TYPE *end_value,INCREMENT_TYPE *increment_value)

{
  TYPE TVar1;
  int64_t *in_RCX;
  int64_t *in_RDX;
  undefined8 *in_R8;
  INCREMENT_TYPE IVar2;
  undefined1 in_stack_ffffffffffffffb8 [16];
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *in_stack_ffffffffffffffc8;
  
  TVar1 = StartListValue(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8._8_8_);
  *in_RDX = TVar1.value;
  TVar1 = EndListValue(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8._8_8_);
  *in_RCX = TVar1.value;
  IVar2 = ListIncrementValue(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  *in_R8 = IVar2._0_8_;
  in_R8[1] = IVar2.micros;
  return;
}

Assistant:

void GetListValues(idx_t row_idx, typename OP::TYPE &start_value, typename OP::TYPE &end_value,
	                   typename OP::INCREMENT_TYPE &increment_value) {
		start_value = StartListValue(row_idx);
		end_value = EndListValue(row_idx);
		increment_value = ListIncrementValue(row_idx);
	}